

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O0

TransactionStructApiBase * __thiscall
cfd::js::api::TransactionStructApiBase::
ConvertSignDataStructToSignParameter<cfd::js::api::PubkeySignDataStruct>
          (TransactionStructApiBase *this,PubkeySignDataStruct *sign_data)

{
  bool bVar1;
  bool bVar2;
  PubkeySignDataStruct *pPVar3;
  bool bVar4;
  string *psVar5;
  ByteData local_158;
  Script local_140;
  Pubkey local_108;
  ScriptOperator local_f0;
  allocator local_b9;
  string local_b8 [36];
  TransactionStructApiBase local_94 [12];
  ByteData local_88;
  SignDataType local_6c;
  SigHashType local_68 [4];
  SignDataType data_type;
  allocator local_49;
  string local_48 [36];
  TransactionStructApiBase local_24 [12];
  PubkeySignDataStruct *local_18;
  PubkeySignDataStruct *sign_data_local;
  
  local_18 = sign_data;
  sign_data_local = (PubkeySignDataStruct *)this;
  bVar4 = std::operator==(&sign_data->type,"auto");
  pPVar3 = local_18;
  if (bVar4) {
    if ((local_18->der_encode & 1U) == 0) {
      cfd::core::SigHashType::SigHashType(local_68,kSigHashAll,false,false);
      cfd::SignParameter::SignParameter((SignParameter *)this,pPVar3,0,local_68);
    }
    else {
      bVar4 = local_18->der_encode;
      bVar1 = local_18->sighash_anyone_can_pay;
      psVar5 = &local_18->sighash_type;
      bVar2 = local_18->sighash_rangeproof;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"",&local_49);
      ConvertSigHashType(local_24,psVar5,(bool)(bVar1 & 1),(bool)(bVar2 & 1),false,
                         (string *)local_48);
      cfd::SignParameter::SignParameter((SignParameter *)this,pPVar3,bVar4 & 1,local_24);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  else {
    local_6c = ConvertToSignDataType(&local_18->type);
    switch(local_6c) {
    case kSign:
      cfd::core::ByteData::ByteData(&local_88,(string *)local_18);
      bVar4 = local_18->der_encode;
      bVar1 = local_18->sighash_anyone_can_pay;
      psVar5 = &local_18->sighash_type;
      bVar2 = local_18->sighash_rangeproof;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"",&local_b9);
      ConvertSigHashType(local_94,psVar5,(bool)(bVar1 & 1),(bool)(bVar2 & 1),false,
                         (string *)local_b8);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_88,bVar4 & 1,local_94);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      core::ByteData::~ByteData(&local_88);
      break;
    case kBinary:
    default:
      cfd::core::ByteData::ByteData(&local_158,(string *)local_18);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_158);
      core::ByteData::~ByteData(&local_158);
      break;
    case kPubkey:
      cfd::core::Pubkey::Pubkey(&local_108,(string *)local_18);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_108);
      core::Pubkey::~Pubkey(&local_108);
      break;
    case kRedeemScript:
      cfd::core::Script::Script(&local_140,(string *)local_18);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_140);
      core::Script::~Script(&local_140);
      break;
    case kOpCode:
      cfd::core::ScriptOperator::Get((string *)&local_f0);
      cfd::SignParameter::SignParameter((SignParameter *)this,&local_f0);
      core::ScriptOperator::~ScriptOperator(&local_f0);
    }
  }
  return this;
}

Assistant:

SignParameter TransactionStructApiBase::ConvertSignDataStructToSignParameter(
    const SignStructClass& sign_data) {
  if (sign_data.type == "auto") {
    // insert text directly
    if (sign_data.der_encode) {
      return SignParameter(
          sign_data.hex, sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    } else {
      return SignParameter(sign_data.hex);
    }
  }
  SignDataType data_type = ConvertToSignDataType(sign_data.type);
  switch (data_type) {
    case kSign:
      return SignParameter(
          ByteData(sign_data.hex), sign_data.der_encode,
          TransactionStructApiBase::ConvertSigHashType(
              sign_data.sighash_type, sign_data.sighash_anyone_can_pay,
              sign_data.sighash_rangeproof));
    case kOpCode:
      return SignParameter(ScriptOperator::Get(sign_data.hex));
    case kPubkey:
      return SignParameter(Pubkey(sign_data.hex));
    case kRedeemScript:
      return SignParameter(Script(sign_data.hex));
    case kBinary:
      // fall-through
    default:
      return SignParameter(ByteData(sign_data.hex));
  }
}